

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionTracking::TestCaseTracker::leaveSection(TestCaseTracker *this)

{
  TrackedSection *pTVar1;
  TestCaseTracker *this_local;
  
  TrackedSection::leave(this->m_currentSection);
  pTVar1 = TrackedSection::getParent(this->m_currentSection);
  this->m_currentSection = pTVar1;
  if (this->m_currentSection != (TrackedSection *)0x0) {
    this->m_completedASectionThisRun = true;
    return;
  }
  __assert_fail("m_currentSection != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/algorithm-ninja[P]konig/konig/tests/Catch/single_include/catch.hpp"
                ,0x13d8,"void Catch::SectionTracking::TestCaseTracker::leaveSection()");
}

Assistant:

void leaveSection() {
            m_currentSection->leave();
            m_currentSection = m_currentSection->getParent();
            assert( m_currentSection != NULL );
            m_completedASectionThisRun = true;
        }